

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<int,_int,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<int,_int,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *this,int *key)

{
  int *piVar1;
  SimpleHashedEntry<int,_int> *pSVar2;
  uint uVar3;
  Type this_00;
  uint uVar4;
  
  piVar1 = (this->buckets).ptr;
  uVar3 = 0;
  if (piVar1 != (int *)0x0) {
    uVar3 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar4 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar4) {
      pSVar2 = (this->entries).ptr;
      uVar3 = 0;
      do {
        if (pSVar2[uVar4].
            super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            .super_ImplicitKeyValueEntry<int,_int>.
            super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
            super_ValueEntryData<int>.value == *key) {
          this_00 = this->stats;
          goto LAB_00b4f9ef;
        }
        uVar3 = uVar3 + 1;
        uVar4 = pSVar2[uVar4].
                super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<int,_int>.
                super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
                super_ValueEntryData<int>.next;
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = this->stats;
  uVar4 = 0xffffffff;
LAB_00b4f9ef:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return -1 < (int)uVar4;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }